

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

int MPLSParser::composeUHD_metadata(uint8_t *buffer,int bufferSize)

{
  int iVar1;
  int iVar2;
  long lVar3;
  BitStreamWriter writer;
  BitStreamWriter local_38;
  
  local_38.super_BitStream.m_totalBits = 0;
  local_38.super_BitStream.m_buffer = (uint *)0x0;
  local_38.super_BitStream.m_initBuffer = (uint *)0x0;
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  BitStream::setBuffer(&local_38.super_BitStream,buffer,buffer + bufferSize);
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_38,0x20,0x20);
  BitStreamWriter::putBits(&local_38,0x20,0x1000000);
  BitStreamWriter::putBits(&local_38,0x20,0x10000000);
  lVar3 = 0;
  do {
    BitStreamWriter::putBits(&local_38,0x20,*(uint *)((long)HDR10_metadata + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x18);
  BitStreamWriter::flushBits(&local_38);
  iVar1 = local_38.m_bitWrited +
          ((int)local_38.super_BitStream.m_buffer - (int)local_38.super_BitStream.m_initBuffer) * 8;
  iVar2 = local_38.m_bitWrited +
          ((int)local_38.super_BitStream.m_buffer - (int)local_38.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  return iVar2 >> 3;
}

Assistant:

int MPLSParser::composeUHD_metadata(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        writer.putBits(32, 0x20);
        writer.putBits(32, 1 << 24);
        writer.putBits(32, 1 << 28);
        for (const unsigned i : HDR10_metadata) writer.putBits(32, i);
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}